

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Vector<kj::ArrayPtr<const_char>_> * __thiscall
kj::_::splitParts(Vector<kj::ArrayPtr<const_char>_> *__return_storage_ptr__,_ *this,
                 ArrayPtr<const_char> input,char delim)

{
  size_t sVar1;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> AVar2;
  undefined1 local_48 [8];
  ArrayPtr<const_char> part;
  undefined1 auStack_20 [7];
  char delim_local;
  ArrayPtr<const_char> input_local;
  Vector<kj::ArrayPtr<const_char>_> *parts;
  
  input_local.ptr = input.ptr;
  _auStack_20 = this;
  input_local.size_ = (size_t)__return_storage_ptr__;
  Vector<kj::ArrayPtr<const_char>_>::Vector(__return_storage_ptr__);
  while (sVar1 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20), sVar1 != 0) {
    AVar2 = splitNext((ArrayPtr<const_char> *)auStack_20,(char)input.size_);
    part.ptr = (char *)AVar2.size_;
    local_48 = (undefined1  [8])AVar2.ptr;
    stripLeadingAndTrailingSpace((ArrayPtr<const_char> *)local_48);
    params = mv<kj::ArrayPtr<char_const>>((ArrayPtr<const_char> *)local_48);
    Vector<kj::ArrayPtr<char_const>>::add<kj::ArrayPtr<char_const>>
              ((Vector<kj::ArrayPtr<char_const>> *)__return_storage_ptr__,params);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<kj::ArrayPtr<const char>> splitParts(kj::ArrayPtr<const char> input, char delim) {
  // Given a string `input` and a delimiter `delim`, split the string into a vector of substrings,
  // separated by the delimiter. Note that leading/trailing whitespace is stripped from each element.
  kj::Vector<kj::ArrayPtr<const char>> parts;

  while (input.size() != 0) {
    auto part = splitNext(input, delim);
    stripLeadingAndTrailingSpace(part);
    parts.add(kj::mv(part));
  }

  return parts;
}